

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O0

bool __thiscall
luna::Lexer::LexNumber::anon_class_1_0_00000001::operator()(anon_class_1_0_00000001 *this,int c)

{
  bool local_d;
  int c_local;
  anon_class_1_0_00000001 *this_local;
  
  local_d = c == 0x65 || c == 0x45;
  return local_d;
}

Assistant:

int Lexer::LexNumberX(TokenDetail *detail, bool integer_part,
                          const std::function<bool (int)> &is_number_char,
                          const std::function<bool (int)> &is_exponent)
    {
        while (is_number_char(current_))
        {
            token_buffer_.push_back(current_);
            current_ = Next();
            integer_part = true;
        }

        bool point = false;
        if (current_ == '.')
        {
            token_buffer_.push_back(current_);
            current_ = Next();
            point = true;
        }

        return LexNumberXFractional(detail, integer_part, point,
                                    is_number_char, is_exponent);
    }